

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_number_table.cpp
# Opt level: O0

void __thiscall
spvtools::opt::ValueNumberTable::BuildDominatorTreeValueNumberTable(ValueNumberTable *this)

{
  bool bVar1;
  uint32_t uVar2;
  IRContext *pIVar3;
  Module *this_00;
  reference this_01;
  Instruction *pIVar4;
  Instruction *inst_5;
  iterator __end4;
  iterator __begin4;
  BasicBlock *__range4;
  BasicBlock *block;
  iterator __end3;
  iterator __begin3;
  Function *__range3;
  Function *func;
  iterator __end2_5;
  iterator __begin2_5;
  Module *__range2_5;
  Instruction *inst_4;
  iterator __end2_4;
  iterator __begin2_4;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2_4;
  Instruction *inst_3;
  iterator __end2_3;
  iterator __begin2_3;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2_3;
  Instruction *inst_2;
  iterator __end2_2;
  iterator __begin2_2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2_2;
  Instruction *inst_1;
  iterator __end2_1;
  iterator __begin2_1;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2_1;
  Instruction *inst;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  ValueNumberTable *this_local;
  
  context(this);
  IRContext::annotations((IRContext *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&inst);
  while( true ) {
    bVar1 = utils::operator!=(&__end2.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&inst);
    if (!bVar1) break;
    pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    uVar2 = opt::Instruction::result_id(pIVar4);
    if (uVar2 != 0) {
      AssignValueNumber(this,pIVar4);
    }
    InstructionList::iterator::operator++(&__end2);
  }
  context(this);
  IRContext::capabilities((IRContext *)&__begin2_1);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2_1);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&inst_1);
  while( true ) {
    bVar1 = utils::operator!=(&__end2_1.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&inst_1);
    if (!bVar1) break;
    pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*(&__end2_1.super_iterator);
    uVar2 = opt::Instruction::result_id(pIVar4);
    if (uVar2 != 0) {
      AssignValueNumber(this,pIVar4);
    }
    InstructionList::iterator::operator++(&__end2_1);
  }
  context(this);
  IRContext::types_values((IRContext *)&__begin2_2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2_2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&inst_2);
  while( true ) {
    bVar1 = utils::operator!=(&__end2_2.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&inst_2);
    if (!bVar1) break;
    pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*(&__end2_2.super_iterator);
    uVar2 = opt::Instruction::result_id(pIVar4);
    if (uVar2 != 0) {
      AssignValueNumber(this,pIVar4);
    }
    InstructionList::iterator::operator++(&__end2_2);
  }
  pIVar3 = context(this);
  IRContext::module(pIVar3);
  Module::ext_inst_imports((Module *)&__begin2_3);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2_3);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&inst_3);
  while( true ) {
    bVar1 = utils::operator!=(&__end2_3.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&inst_3);
    if (!bVar1) break;
    pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*(&__end2_3.super_iterator);
    uVar2 = opt::Instruction::result_id(pIVar4);
    if (uVar2 != 0) {
      AssignValueNumber(this,pIVar4);
    }
    InstructionList::iterator::operator++(&__end2_3);
  }
  pIVar3 = context(this);
  IRContext::module(pIVar3);
  Module::ext_inst_debuginfo((Module *)&__begin2_4);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2_4);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&inst_4);
  while( true ) {
    bVar1 = utils::operator!=(&__end2_4.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&inst_4);
    if (!bVar1) break;
    pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*(&__end2_4.super_iterator);
    uVar2 = opt::Instruction::result_id(pIVar4);
    if (uVar2 != 0) {
      AssignValueNumber(this,pIVar4);
    }
    InstructionList::iterator::operator++(&__end2_4);
  }
  pIVar3 = context(this);
  this_00 = IRContext::module(pIVar3);
  join_0x00000010_0x00000000_ = Module::begin(this_00);
  _func = Module::end(this_00);
  while( true ) {
    bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2_5.iterator_,
                       (UptrVectorIterator<spvtools::opt::Function,_false> *)&func);
    if (!bVar1) break;
    this_01 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                        ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2_5.iterator_);
    join_0x00000010_0x00000000_ = opt::Function::begin(this_01);
    _block = opt::Function::end(this_01);
    while( true ) {
      bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                        ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end3.iterator_,
                         (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&block);
      if (!bVar1) break;
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end3.iterator_);
      BasicBlock::begin((BasicBlock *)&__end4);
      BasicBlock::end((BasicBlock *)&inst_5);
      while( true ) {
        bVar1 = utils::operator!=(&__end4.super_iterator,
                                  (iterator_template<spvtools::opt::Instruction> *)&inst_5);
        if (!bVar1) break;
        pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator*(&__end4.super_iterator);
        uVar2 = opt::Instruction::result_id(pIVar4);
        if (uVar2 != 0) {
          AssignValueNumber(this,pIVar4);
        }
        InstructionList::iterator::operator++(&__end4);
      }
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end3.iterator_);
    }
    UptrVectorIterator<spvtools::opt::Function,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2_5.iterator_);
  }
  return;
}

Assistant:

void ValueNumberTable::BuildDominatorTreeValueNumberTable() {
  // First value number the headers.
  for (auto& inst : context()->annotations()) {
    if (inst.result_id() != 0) {
      AssignValueNumber(&inst);
    }
  }

  for (auto& inst : context()->capabilities()) {
    if (inst.result_id() != 0) {
      AssignValueNumber(&inst);
    }
  }

  for (auto& inst : context()->types_values()) {
    if (inst.result_id() != 0) {
      AssignValueNumber(&inst);
    }
  }

  for (auto& inst : context()->module()->ext_inst_imports()) {
    if (inst.result_id() != 0) {
      AssignValueNumber(&inst);
    }
  }

  for (auto& inst : context()->module()->ext_inst_debuginfo()) {
    if (inst.result_id() != 0) {
      AssignValueNumber(&inst);
    }
  }

  for (Function& func : *context()->module()) {
    // For best results we want to traverse the code in reverse post order.
    // This happens naturally because of the forward referencing rules.
    for (BasicBlock& block : func) {
      for (Instruction& inst : block) {
        if (inst.result_id() != 0) {
          AssignValueNumber(&inst);
        }
      }
    }
  }
}